

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O2

double __thiscall
icu_63::double_conversion::StringToDoubleConverter::StringToIeee<unsigned_short_const*>
          (StringToDoubleConverter *this,unsigned_short *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  unsigned_short *end;
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  unsigned_short *puVar9;
  unsigned_short uVar10;
  undefined7 in_register_00000009;
  ulong uVar11;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar12;
  unsigned_short uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  char cVar19;
  StringToDoubleConverter *unaff_R14;
  byte bVar20;
  float fVar21;
  double dVar22;
  undefined8 uVar23;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  DiyFp diy_fp;
  byte local_39c;
  unsigned_short *local_398;
  unsigned_short *local_390;
  uint local_388;
  bool result_is_junk;
  int *local_380;
  double local_378;
  undefined8 uStack_370;
  ulong local_360;
  uint local_354;
  char *start;
  char buffer [782];
  
  *processed_characters_count = 0;
  if (length == 0) {
    return this->empty_string_value_;
  }
  local_378 = (double)CONCAT44(local_378._4_4_,(int)CONCAT71(in_register_00000009,read_as_double));
  end = input + length;
  uVar3 = this->flags_;
  local_398 = input;
  local_390._0_4_ = length;
  if ((uVar3 & 0x18) != 0) {
    bVar6 = AdvanceToNonspace<unsigned_short_const*>(&local_398,end);
    if (!bVar6) {
      *processed_characters_count = (int)((ulong)((long)local_398 - (long)input) >> 1);
      return this->empty_string_value_;
    }
    unaff_R14 = this;
    if (local_398 != input && (char)((uVar3 & 8) >> 3) == '\0') goto LAB_0024dca4;
  }
  uVar1 = *local_398;
  if ((uVar1 == 0x2d) || (uVar1 == 0x2b)) {
    uVar11 = CONCAT71((int7)((ulong)unaff_R14 >> 8),uVar1 == 0x2d);
    puVar9 = local_398 + 1;
    buffer._0_8_ = puVar9;
    bVar6 = AdvanceToNonspace<unsigned_short_const*>((unsigned_short **)buffer,end);
    if ((!bVar6) ||
       (puVar9 != (unsigned_short *)buffer._0_8_ && (char)((uVar3 & 0x20) >> 5) == '\0'))
    goto LAB_0024dca4;
    local_398 = (unsigned_short *)buffer._0_8_;
    uVar1 = *(ushort *)buffer._0_8_;
  }
  else {
    uVar11 = 0;
  }
  pcVar4 = this->infinity_symbol_;
  cVar19 = (char)uVar11;
  local_39c = (byte)uVar3;
  if ((pcVar4 != (char *)0x0) && ((uint)uVar1 == (int)*pcVar4)) {
    bVar6 = ConsumeSubString<unsigned_short_const*>(&local_398,end,pcVar4);
    if (((bVar6) && (local_398 == end || (uVar3 & 0x14) != 0)) &&
       (((uVar3 & 4) != 0 ||
        (bVar6 = AdvanceToNonspace<unsigned_short_const*>(&local_398,end), !bVar6)))) {
      *processed_characters_count = (int)((ulong)((long)local_398 - (long)input) >> 1);
      if (cVar19 != '\0') {
        return -INFINITY;
      }
      return INFINITY;
    }
    goto LAB_0024dca4;
  }
  pcVar4 = this->nan_symbol_;
  if ((pcVar4 != (char *)0x0) && ((uint)uVar1 == (int)*pcVar4)) {
    bVar6 = ConsumeSubString<unsigned_short_const*>(&local_398,end,pcVar4);
    if (((bVar6) && (local_398 == end || (uVar3 & 0x14) != 0)) &&
       (((uVar3 & 4) != 0 ||
        (bVar6 = AdvanceToNonspace<unsigned_short_const*>(&local_398,end), !bVar6)))) {
      *processed_characters_count = (int)((ulong)((long)local_398 - (long)input) >> 1);
      if (cVar19 != '\0') {
        return -NAN;
      }
      return NAN;
    }
    goto LAB_0024dca4;
  }
  iVar15 = 0;
  if (uVar1 != 0x30) {
    uVar8 = 0;
    puVar9 = local_398;
LAB_0024d6bf:
    uVar17 = 0;
    bVar6 = false;
    uVar18 = 0;
    do {
      local_398 = puVar9;
      uVar2 = *local_398;
      if (9 < (ushort)(uVar2 - 0x30)) {
        uVar12 = uVar8;
        if (iVar15 == 0) {
          uVar12 = 0;
        }
        iVar16 = 0;
        puVar9 = local_398;
        if (uVar2 != 0x2e) goto LAB_0024da33;
        if (((local_39c >> 2 | ~(byte)uVar12) & 1) == 0) goto LAB_0024dca4;
        iVar16 = 0;
        local_380 = processed_characters_count;
        if ((uVar12 & 1) != 0) goto LAB_0024d72e;
        puVar9 = local_398 + 1;
        if (puVar9 != end) {
          iVar16 = 0;
          if (iVar15 != 0) goto LAB_0024d89b;
          iVar16 = 0;
          goto LAB_0024dac8;
        }
        uVar12 = uVar8;
        if (iVar15 == 0) {
          local_398 = puVar9;
          if (uVar1 == 0x30) goto LAB_0024d8f4;
          goto LAB_0024dca4;
        }
        break;
      }
      if (iVar15 < 0x304) {
        lVar14 = (long)(int)uVar18;
        uVar18 = uVar18 + 1;
        buffer[lVar14] = (char)uVar2;
        iVar15 = iVar15 + 1;
      }
      else {
        uVar17 = (ulong)((int)uVar17 + 1);
        bVar6 = (bool)(uVar2 != 0x30 | bVar6);
      }
      if ((uVar8 & 1) == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)(*local_398 < 0x38);
      }
      puVar9 = local_398 + 1;
      uVar12 = uVar8;
    } while (local_398 + 1 != end);
    local_398 = local_398 + 1;
    iVar16 = 0;
    local_380 = processed_characters_count;
    goto LAB_0024d72e;
  }
  puVar9 = local_398 + 1;
  if (puVar9 == end) {
LAB_0024d81f:
    *processed_characters_count = (int)local_390;
LAB_0024d826:
    if (cVar19 == '\0') {
      return 0.0;
    }
    return -0.0;
  }
  if (((uVar3 & 1) == 0) || ((*puVar9 | 0x20) != 0x78)) {
    do {
      if (*puVar9 != 0x30) {
        uVar8 = (ulong)(local_39c >> 1);
        goto LAB_0024d6bf;
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != end);
    goto LAB_0024d81f;
  }
  puVar9 = local_398 + 2;
  if ((puVar9 == end) || (local_390 = end, bVar6 = isDigit((uint)*puVar9,0x10), !bVar6))
  goto LAB_0024dca4;
  uVar23 = 0;
  do {
    if (*puVar9 != 0x30) {
      uVar11 = 0x18;
      if (local_378._0_1_ != '\0') {
        uVar11 = 0x35;
      }
      lVar14 = 0;
      uStack_370 = 0;
      goto LAB_0024d9a5;
    }
    puVar9 = puVar9 + 1;
  } while (puVar9 != local_390);
  local_398 = puVar9;
  if (cVar19 == '\0') {
    local_378 = 0.0;
    uVar23 = 0;
    goto LAB_0024dc08;
  }
LAB_0024dab8:
  local_378 = -0.0;
  uVar23 = 0;
LAB_0024dc08:
  if ((uVar3 & 0x10) != 0) {
    uStack_370 = uVar23;
    AdvanceToNonspace<unsigned_short_const*>(&local_398,local_390);
  }
  *processed_characters_count = (int)((ulong)((long)local_398 - (long)input) >> 1);
  return local_378;
LAB_0024d9a5:
  uVar1 = *puVar9;
  uVar18 = uVar1 - 0x30;
  local_378 = this->junk_string_value_;
  if (9 < uVar18) {
    if ((ushort)(uVar1 - 0x61) < 6) {
      uVar18 = uVar1 - 0x57;
    }
    else {
      if (5 < (ushort)(uVar1 - 0x41)) {
        if (((uVar3 & 4) == 0) &&
           (local_398 = puVar9,
           bVar6 = AdvanceToNonspace<unsigned_short_const*>(&local_398,local_390),
           uVar23 = uStack_370, puVar9 = local_398, bVar6)) {
          return local_378;
        }
        goto LAB_0024d9fb;
      }
      uVar18 = uVar1 - 0x37;
    }
  }
  lVar14 = (ulong)uVar18 + lVar14 * 0x10;
  uVar8 = lVar14 >> (sbyte)uVar11;
  puVar9 = puVar9 + 1;
  if ((int)uVar8 == 0) {
    if (puVar9 == local_390) goto LAB_0024d9fb;
    goto LAB_0024d9a5;
  }
  iVar15 = 1;
  local_388 = 0;
  for (; 1 < (int)(uint)uVar8; uVar8 = (ulong)((uint)uVar8 >> 1)) {
    iVar15 = iVar15 + 1;
    local_388 = local_388 + 1;
  }
  uVar17 = lVar14 >> ((byte)iVar15 & 0x3f);
  local_354 = (uint)lVar14 & ~(-1 << ((byte)iVar15 & 0x1f));
  uVar8 = (ulong)local_354;
  iVar15 = -iVar15;
  bVar20 = 1;
  local_380 = processed_characters_count;
  local_360 = uVar11;
  for (; puVar9 != local_390; puVar9 = puVar9 + 1) {
    uVar1 = *puVar9;
    bVar6 = isDigit((uint)uVar1,0x10);
    uVar8 = extraout_RDX;
    if (!bVar6) break;
    bVar20 = bVar20 & uVar1 == 0x30;
    iVar15 = iVar15 + -4;
  }
  processed_characters_count = local_380;
  local_398 = puVar9;
  if (((uVar3 & 4) == 0) &&
     (bVar6 = AdvanceToNonspace<unsigned_short_const*>(&local_398,local_390),
     uVar8 = extraout_RDX_00, bVar6)) {
    return local_378;
  }
  uVar18 = 1 << ((byte)local_388 & 0x1f);
  if ((int)uVar18 < (int)local_354) {
    uVar17 = uVar17 + 1;
  }
  else if (local_354 == uVar18) {
    uVar17 = uVar17 + ((byte)(~bVar20 | (byte)uVar17) & 1);
  }
  bVar6 = (uVar17 >> (local_360 & 0x3f) & 1) != 0;
  diy_fp.f_ = (ulong)((uint)bVar6 - iVar15);
  diy_fp._8_8_ = uVar8;
  local_378 = (double)Double::DiyFpToUint64((Double *)((long)uVar17 >> bVar6),diy_fp);
  uVar23 = 0;
  goto LAB_0024dc08;
LAB_0024d9fb:
  local_398 = puVar9;
  if (cVar19 != '\0') {
    if (lVar14 == 0) goto LAB_0024dab8;
    lVar14 = -lVar14;
  }
  local_378 = (double)lVar14;
  goto LAB_0024dc08;
LAB_0024dac8:
  if (*puVar9 != 0x30) goto LAB_0024d89b;
  puVar9 = puVar9 + 1;
  if (puVar9 == end) {
    *processed_characters_count = (int)local_390;
    goto LAB_0024d826;
  }
  iVar16 = iVar16 + -1;
  goto LAB_0024dac8;
  while( true ) {
    if (iVar15 < 0x304) {
      lVar14 = (long)(int)uVar18;
      uVar18 = uVar18 + 1;
      buffer[lVar14] = (char)uVar2;
      iVar15 = iVar15 + 1;
      iVar16 = iVar16 + -1;
    }
    else {
      bVar6 = (bool)(uVar2 != 0x30 | bVar6);
    }
    puVar9 = puVar9 + 1;
    local_398 = puVar9;
    if (puVar9 == end) break;
LAB_0024d89b:
    uVar2 = *puVar9;
    if (9 < (ushort)(uVar2 - 0x30)) goto LAB_0024da33;
  }
  goto LAB_0024d72e;
LAB_0024da33:
  if (((uVar1 != 0x30) && (iVar16 == 0)) && (iVar15 == 0)) goto LAB_0024dca4;
  local_398 = puVar9;
  if ((uVar2 | 0x20) == 0x65) {
    if (((~(byte)uVar12 | local_39c >> 2) & 1) == 0) goto LAB_0024dca4;
    local_380 = processed_characters_count;
    if ((uVar12 & 1) != 0) goto LAB_0024d72e;
    local_398 = puVar9 + 1;
    local_390._0_4_ = iVar16;
    if (local_398 != end) {
      uVar10 = *local_398;
      if ((uVar10 == 0x2d) || (uVar10 == 0x2b)) {
        local_398 = puVar9 + 2;
        if (local_398 == end) goto LAB_0024dbb7;
      }
      else {
        uVar10 = 0x2b;
      }
      if ((local_398 != end) && (uVar13 = *local_398, 0xfff5 < (ushort)(uVar13 - 0x3a))) {
        iVar15 = 0;
        do {
          local_398 = local_398 + 1;
          if ((iVar15 < 0x6666666) || ((iVar5 = 0x3fffffff, iVar15 == 0x6666666 && (uVar13 < 0x34)))
             ) {
            iVar5 = (uint)uVar13 + iVar15 * 10 + -0x30;
          }
          iVar15 = iVar5;
        } while ((local_398 != end) && (uVar13 = *local_398, (ushort)(uVar13 - 0x30) < 10));
        iVar5 = -iVar15;
        if ((char)uVar10 != '-') {
          iVar5 = iVar15;
        }
        iVar16 = iVar16 + iVar5;
        goto LAB_0024dc98;
      }
    }
LAB_0024dbb7:
    if ((uVar3 & 4) != 0) {
LAB_0024d72e:
      if ((uVar12 & 1) != 0) {
        start = buffer;
        dVar22 = RadixStringToIeee<3,char*>
                           (&start,buffer + (int)uVar18,SUB81(uVar11,0),SUB41((uVar3 & 4) >> 2,0),
                            this->junk_string_value_,(bool)local_378._0_1_,&result_is_junk);
        *local_380 = (int)((ulong)((long)local_398 - (long)input) >> 1);
        return dVar22;
      }
      uVar17 = (ulong)(uint)((int)uVar17 + iVar16);
LAB_0024d8f4:
      if (bVar6) {
        lVar14 = (long)(int)uVar18;
        uVar18 = uVar18 + 1;
        buffer[lVar14] = '1';
        uVar17 = (ulong)((int)uVar17 - 1);
      }
      buffer[(int)uVar18] = '\0';
      buffer_00.start_ = (char *)(ulong)uVar18;
      if (SUB81(local_378,0) == '\0') {
        buffer_01._8_8_ = uVar17;
        buffer_01.start_ = buffer_00.start_;
        fVar21 = Strtof((double_conversion *)buffer,buffer_01,local_378._0_4_);
        dVar22 = (double)fVar21;
      }
      else {
        buffer_00._8_8_ = uVar17;
        dVar22 = Strtod((double_conversion *)buffer,buffer_00,local_378._0_4_);
      }
      *local_380 = (int)((ulong)((long)local_398 - (long)input) >> 1);
      if ((char)uVar11 == '\0') {
        return dVar22;
      }
      return -dVar22;
    }
  }
  else {
LAB_0024dc98:
    if (((uVar3 & 0x14) != 0) || (local_398 == end)) {
      local_360 = CONCAT44(local_360._4_4_,(int)uVar12);
      local_388 = (uint)uVar11;
      local_380 = processed_characters_count;
      if (((uVar3 & 4) != 0) ||
         (local_390._0_4_ = iVar16, bVar7 = AdvanceToNonspace<unsigned_short_const*>(&local_398,end)
         , iVar16 = (int)local_390, !bVar7)) {
        if ((uVar3 & 0x10) != 0) {
          AdvanceToNonspace<unsigned_short_const*>(&local_398,end);
        }
        uVar11 = (ulong)local_388;
        uVar12 = local_360 & 0xffffffff;
        goto LAB_0024d72e;
      }
    }
  }
LAB_0024dca4:
  return this->junk_string_value_;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  char buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != NULL) {
    if (*current == infinity_symbol_[0]) {
      if (!ConsumeSubString(&current, end, infinity_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != NULL) {
    if (*current == nan_symbol_[0]) {
      if (!ConsumeSubString(&current, end, nan_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    ++current;
    if (current == end) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if ((flags_ & ALLOW_HEX) && (*current == 'x' || *current == 'X')) {
      ++current;
      if (current == end || !isDigit(*current, 16)) {
        return junk_string_value_;  // "0x".
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      ++current;
      if (current == end) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    ++current;
    if (current == end) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    ++current;
    if (current == end) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        ++current;
        if (current == end) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      ++current;
      if (current == end) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  double converted;
  if (read_as_double) {
    converted = Strtod(Vector<const char>(buffer, buffer_pos), exponent);
  } else {
    converted = Strtof(Vector<const char>(buffer, buffer_pos), exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}